

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void cpu_instr_rlc(gb_cpu_t *cpu,uint8_t *value_ptr)

{
  byte bVar1;
  int msb;
  uint8_t *value_ptr_local;
  gb_cpu_t *cpu_local;
  
  bVar1 = *value_ptr;
  *value_ptr = *value_ptr << 1 | (byte)((int)(uint)bVar1 >> 7);
  (cpu->field_0).field_0.reg_f = (cpu->field_0).field_0.reg_f & 0x7f | (*value_ptr == '\0') << 7;
  (cpu->field_0).field_0.reg_f = (cpu->field_0).field_0.reg_f & 0xbf;
  (cpu->field_0).field_0.reg_f = (cpu->field_0).field_0.reg_f & 0xdf;
  (cpu->field_0).field_0.reg_f =
       (cpu->field_0).field_0.reg_f & 0xef | (byte)(((int)(uint)bVar1 >> 7) << 4);
  return;
}

Assistant:

static inline void cpu_instr_rlc(gb_cpu_t *cpu, uint8_t *value_ptr)
{
    int msb = *value_ptr >> 7;

    *value_ptr = (*value_ptr << 1) | msb;

    SET_Z(ZERO_CHECK(*value_ptr));
    SET_N(0);
    SET_H(0);
    SET_C(msb);
}